

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::ParsedExpression,duckdb::CastExpression,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
          (duckdb *this,LogicalType *args,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *args_1)

{
  CastExpression *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  LogicalType local_38;
  
  this_00 = (CastExpression *)operator_new(0x60);
  LogicalType::LogicalType(&local_38,args);
  local_40._M_head_impl =
       (args_1->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (args_1->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  CastExpression::CastExpression
            (this_00,&local_38,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_40,false);
  *(CastExpression **)this = this_00;
  if (local_40._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_40._M_head_impl = (ParsedExpression *)0x0;
  LogicalType::~LogicalType(&local_38);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}